

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isUInt64(Value *this)

{
  bool bVar1;
  byte bVar2;
  double *in_RDI;
  unsigned_long_long val;
  Value *in_stack_000001a8;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  string *str;
  bool local_59;
  string local_38 [32];
  unsigned_long_long local_18;
  bool local_1;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 1:
  case 3:
    local_1 = -1 < (long)*in_RDI;
    break;
  case 2:
    local_1 = true;
    break;
  case 4:
    local_59 = false;
    if ((0.0 <= *in_RDI) &&
       (local_59 = false, *in_RDI <= 1.8446744073709552e+19 && *in_RDI != 1.8446744073709552e+19)) {
      local_59 = IsIntegral((double)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    }
    local_1 = local_59;
    break;
  case 5:
    str = local_38;
    asString_abi_cxx11_(in_stack_000001a8);
    std::__cxx11::string::c_str();
    bVar1 = converToUInt64((char *)str,
                           (unsigned_long_long *)
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_38);
    if ((bVar2 & 1) == 0) {
      bVar1 = IsInRange<unsigned_long_long,int,unsigned_long_long>(local_18,0,0xffffffffffffffff);
      return bVar1;
    }
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::isUInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case int64Value:
  case intValue:
    return value_.int_ >= 0;
  case uintValue:
    return true;
  case realValue:
    // Note that maxUInt64 (= 2^64 - 1) is not exactly representable as a
    // double, so double(maxUInt64) will be rounded up to 2^64. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= 0 && value_.real_ < maxUInt64AsDouble &&
           IsIntegral(value_.real_);
  case stringValue:
    unsigned long long int val;

    if (!converToUInt64 (asString().c_str(), &val)) {
      break;
    }

    return IsInRange (val, 0, maxUInt64);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}